

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

int nni_url_clone_inline(nng_url *dst,nng_url *src)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  
  if (src->u_bufsz == 0) {
    pcVar1 = src->u_static;
    pcVar3 = dst->u_static;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined8 *)pcVar3 = *(undefined8 *)pcVar1;
      pcVar1 = pcVar1 + 8;
      pcVar3 = pcVar3 + 8;
    }
    dst->u_buffer = src->u_buffer + (0x48 - (long)src->u_static) + (long)(dst->u_static + -0x48);
  }
  else {
    pcVar1 = (char *)nni_alloc(dst->u_bufsz);
    dst->u_buffer = pcVar1;
    if (pcVar1 == (char *)0x0) {
      return 2;
    }
    dst->u_bufsz = src->u_bufsz;
    memcpy(pcVar1,src->u_buffer,src->u_bufsz);
  }
  pcVar1 = dst->u_buffer;
  pcVar3 = src->u_buffer;
  dst->u_hostname = pcVar1 + ((long)src->u_hostname - (long)pcVar3);
  dst->u_path = pcVar1 + ((long)src->u_path - (long)pcVar3);
  if (src->u_userinfo != (char *)0x0) {
    dst->u_userinfo = pcVar1 + ((long)src->u_userinfo - (long)pcVar3);
  }
  if (src->u_query != (char *)0x0) {
    dst->u_query = pcVar1 + ((long)src->u_query - (long)pcVar3);
  }
  if (src->u_fragment != (char *)0x0) {
    dst->u_fragment = pcVar1 + ((long)src->u_fragment - (long)pcVar3);
  }
  dst->u_scheme = src->u_scheme;
  dst->u_port = src->u_port;
  return 0;
}

Assistant:

int
nni_url_clone_inline(nng_url *dst, const nng_url *src)
{
	if (src->u_bufsz != 0) {
		if ((dst->u_buffer = nni_alloc(dst->u_bufsz)) == NULL) {
			return (NNG_ENOMEM);
		}
		dst->u_bufsz = src->u_bufsz;
		memcpy(dst->u_buffer, src->u_buffer, src->u_bufsz);
	} else {
		memcpy(dst->u_static, src->u_static, sizeof(src->u_static));
		dst->u_buffer =
		    dst->u_static + (src->u_buffer - src->u_static);
	}

	dst->u_hostname = dst->u_buffer + (src->u_hostname - src->u_buffer);
	dst->u_path     = dst->u_buffer + (src->u_path - src->u_buffer);

	if (src->u_userinfo != NULL) {
		dst->u_userinfo =
		    dst->u_buffer + (src->u_userinfo - src->u_buffer);
	}
	if (src->u_query != NULL) {
		dst->u_query = dst->u_buffer + (src->u_query - src->u_buffer);
	}
	if (src->u_fragment != NULL) {
		dst->u_fragment =
		    dst->u_buffer + (src->u_fragment - src->u_buffer);
	}
	dst->u_scheme = src->u_scheme;
	dst->u_port   = src->u_port;
	return (0);
}